

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLin>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterXsYs<float> *pGVar6;
  ImDrawVert *pIVar7;
  ImDrawIdx *pIVar8;
  ImDrawIdx IVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pGVar6 = this->Getter;
  iVar3 = pGVar6->Count;
  lVar10 = (long)(((pGVar6->Offset + prim + 1) % iVar3 + iVar3) % iVar3) * (long)pGVar6->Stride;
  iVar3 = this->Transformer->YAxis;
  fVar15 = (float)(((double)*(float *)((long)pGVar6->Xs + lVar10) -
                   (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                  (double)GImPlot->PixelRange[iVar3].Min.x);
  fVar16 = (float)(((double)*(float *)((long)pGVar6->Ys + lVar10) -
                   GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) * GImPlot->My[iVar3] +
                  (double)GImPlot->PixelRange[iVar3].Min.y);
  fVar14 = (this->P1).x;
  fVar17 = (this->P1).y;
  fVar13 = fVar17;
  if (fVar16 <= fVar17) {
    fVar13 = fVar16;
  }
  bVar11 = false;
  if ((fVar13 < (cull_rect->Max).y) &&
     (fVar13 = (float)(-(uint)(fVar16 <= fVar17) & (uint)fVar17 |
                      ~-(uint)(fVar16 <= fVar17) & (uint)fVar16), pfVar1 = &(cull_rect->Min).y,
     bVar11 = false, *pfVar1 <= fVar13 && fVar13 != *pfVar1)) {
    fVar13 = fVar14;
    if (fVar15 <= fVar14) {
      fVar13 = fVar15;
    }
    if (fVar13 < (cull_rect->Max).x) {
      fVar13 = (float)(~-(uint)(fVar15 <= fVar14) & (uint)fVar15 |
                      -(uint)(fVar15 <= fVar14) & (uint)fVar14);
      bVar11 = (cull_rect->Min).x <= fVar13 && fVar13 != (cull_rect->Min).x;
    }
  }
  if (bVar11 != false) {
    fVar13 = this->Weight;
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar14 = fVar15 - fVar14;
    fVar17 = fVar16 - fVar17;
    fVar12 = fVar14 * fVar14 + fVar17 * fVar17;
    if (0.0 < fVar12) {
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      fVar14 = fVar14 * (1.0 / fVar12);
      fVar17 = fVar17 * (1.0 / fVar12);
    }
    fVar13 = fVar13 * 0.5;
    fVar14 = fVar14 * fVar13;
    fVar13 = fVar13 * fVar17;
    pIVar7 = DrawList->_VtxWritePtr;
    (pIVar7->pos).x = (this->P1).x + fVar13;
    (pIVar7->pos).y = (this->P1).y - fVar14;
    pIVar7->uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = IVar4;
    pIVar7[1].pos.x = fVar13 + fVar15;
    pIVar7[1].pos.y = fVar16 - fVar14;
    pIVar7[1].uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = IVar4;
    pIVar7[2].pos.x = fVar15 - fVar13;
    pIVar7[2].pos.y = fVar14 + fVar16;
    pIVar7[2].uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = IVar4;
    pIVar7[3].pos.x = (this->P1).x - fVar13;
    pIVar7[3].pos.y = fVar14 + (this->P1).y;
    pIVar7[3].uv = IVar2;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar7 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar8 = DrawList->_IdxWritePtr;
    IVar9 = (ImDrawIdx)uVar5;
    *pIVar8 = IVar9;
    pIVar8[1] = IVar9 + 1;
    pIVar8[2] = IVar9 + 2;
    pIVar8[3] = IVar9;
    pIVar8[4] = IVar9 + 2;
    pIVar8[5] = IVar9 + 3;
    DrawList->_IdxWritePtr = pIVar8 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  IVar2.y = fVar16;
  IVar2.x = fVar15;
  this->P1 = IVar2;
  return bVar11;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }